

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[9],std::__cxx11::string&,wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [9],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u,Newline *args)

{
  string_view local_48;
  string_view local_38;
  Newline *local_28;
  Newline *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_local;
  char (*t_local) [9];
  CWriter *this_local;
  
  local_28 = args;
  args_local = (Newline *)u;
  u_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t;
  t_local = (char (*) [9])this;
  string_view::string_view(&local_38,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_38);
  string_view::string_view(&local_48,(string *)args_local);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }